

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::Validator::validateIndexedArray(Validator *this,uint8_t *ptr,size_t length)

{
  ulong uVar1;
  uint8_t uVar2;
  uint uVar3;
  ulong *puVar4;
  byte *ptr_00;
  ulong uVar5;
  Exception *this_00;
  byte bVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  char *msg;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  bool bVar15;
  byte *local_38;
  
  uVar2 = *ptr;
  bVar6 = uVar2 - 6;
  lVar14 = 1L << (bVar6 & 0x3f);
  validateBufferLength(this,(2L << (bVar6 & 0x3f)) + 2,length,true);
  puVar4 = (ulong *)(ptr + 1);
  uVar1 = lVar14 - 1;
  switch(uVar1) {
  case 0:
    uVar11 = (ulong)(byte)*puVar4;
    break;
  case 1:
    uVar11 = (ulong)(ushort)*puVar4;
    break;
  case 2:
    uVar10 = (ulong)ptr[1];
    uVar11 = (ulong)*(ushort *)(ptr + 2) << 8;
    goto LAB_0010bbf7;
  case 3:
    uVar11 = (ulong)*(uint *)(ptr + 1);
    break;
  case 4:
    uVar3 = (uint)*puVar4;
    uVar11 = (ulong)ptr[5];
    goto LAB_0010bbf3;
  case 5:
    uVar3 = (uint)*puVar4;
    uVar11 = (ulong)*(ushort *)(ptr + 5);
LAB_0010bbf3:
    uVar10 = (ulong)uVar3;
    uVar11 = uVar11 << 0x20;
LAB_0010bbf7:
    uVar11 = uVar11 | uVar10;
    break;
  case 6:
    uVar11 = (ulong)(uint7)*puVar4;
    break;
  case 7:
    uVar11 = *puVar4;
    break;
  default:
    uVar11 = 0;
    goto LAB_0010bc1c;
  }
  if (length < uVar11) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array length is out of bounds";
    goto LAB_0010bf2e;
  }
LAB_0010bc1c:
  if (uVar2 == '\t') {
    if (7 < uVar1) goto LAB_0010bf51;
    uVar10 = *(ulong *)(ptr + (uVar11 - lVar14));
    if (uVar10 == 0) goto LAB_0010bf51;
    pbVar12 = (byte *)((long)(ptr + (uVar11 - lVar14)) - (uVar10 << (bVar6 & 0x3f)));
    if ((pbVar12 < ptr + lVar14) || (ptr + lVar14 * -2 + length < pbVar12)) goto LAB_0010bf67;
    ptr_00 = (byte *)((long)puVar4 + lVar14);
    goto code_r0x0010be10;
  }
  if (7 < uVar1) goto LAB_0010bf51;
  puVar4 = (ulong *)((long)puVar4 + lVar14);
  switch(uVar1) {
  case 0:
    uVar10 = (ulong)(byte)*puVar4;
    break;
  case 1:
    uVar10 = (ulong)(ushort)*puVar4;
    break;
  case 2:
    uVar5 = (ulong)(byte)*puVar4;
    uVar10 = (ulong)*(ushort *)((long)puVar4 + 1) << 8;
    goto LAB_0010bcec;
  case 3:
    uVar10 = (ulong)(uint)*puVar4;
    break;
  case 4:
    uVar3 = (uint)*puVar4;
    uVar10 = (ulong)*(byte *)((long)puVar4 + 4);
    goto LAB_0010bce8;
  case 5:
    uVar3 = (uint)*puVar4;
    uVar10 = (ulong)*(ushort *)((long)puVar4 + 4);
LAB_0010bce8:
    uVar5 = (ulong)uVar3;
    uVar10 = uVar10 << 0x20;
LAB_0010bcec:
    uVar10 = uVar10 | uVar5;
    break;
  case 6:
    uVar10 = (ulong)(uint7)*puVar4;
    break;
  case 7:
    uVar10 = *puVar4;
  }
  if (uVar10 == 0) {
LAB_0010bf51:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Array nrItems value is invalid";
  }
  else {
    ptr_00 = (byte *)((long)puVar4 + lVar14);
    pbVar7 = ptr_00 + (-2L << (bVar6 & 0x3f)) + 8;
    pbVar12 = ptr + uVar11;
    pbVar9 = pbVar7;
    if (pbVar12 < pbVar7) {
      pbVar9 = pbVar12;
    }
    pbVar13 = ptr_00;
    if (ptr_00 < pbVar9) {
      do {
        if (*pbVar13 != 0) break;
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 < pbVar9);
      bVar15 = pbVar13 != ptr_00;
      ptr_00 = pbVar13;
      if ((bVar15) && (pbVar13 != pbVar7)) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        msg = "Array padding is invalid";
        goto LAB_0010bf2e;
      }
    }
    pbVar12 = pbVar12 + -(uVar10 << (bVar6 & 0x3f));
    if (((pbVar12 < ptr + lVar14 * 2) || (pbVar12 < ptr_00)) || (ptr + (length - lVar14) < pbVar12))
    {
LAB_0010bf67:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array index table is out of bounds";
    }
    else {
code_r0x0010be10:
      uVar11 = 0;
      for (; ptr_00 < pbVar12; ptr_00 = ptr_00 + uVar5) {
        validatePart(this,ptr_00,(long)pbVar12 - (long)ptr_00,true);
        lVar14 = uVar11 << (bVar6 & 0x3f);
        switch(uVar1) {
        case 0:
          uVar5 = (ulong)pbVar12[lVar14];
          break;
        case 1:
          uVar5 = (ulong)*(ushort *)(pbVar12 + lVar14);
          break;
        case 2:
          uVar8 = (ulong)pbVar12[lVar14];
          uVar5 = (ulong)*(ushort *)(pbVar12 + lVar14 + 1) << 8;
          goto LAB_0010be9e;
        case 3:
          uVar5 = (ulong)*(uint *)(pbVar12 + lVar14);
          break;
        case 4:
          uVar3 = *(uint *)(pbVar12 + lVar14);
          uVar5 = (ulong)pbVar12[lVar14 + 4];
          goto LAB_0010be9a;
        case 5:
          uVar3 = *(uint *)(pbVar12 + lVar14);
          uVar5 = (ulong)*(ushort *)(pbVar12 + lVar14 + 4);
LAB_0010be9a:
          uVar8 = (ulong)uVar3;
          uVar5 = uVar5 << 0x20;
LAB_0010be9e:
          uVar5 = uVar5 | uVar8;
          break;
        case 6:
          uVar5 = (ulong)CONCAT34(CONCAT12(pbVar12[lVar14 + 6],*(undefined2 *)(pbVar12 + lVar14 + 4)
                                          ),*(undefined4 *)(pbVar12 + lVar14));
          break;
        case 7:
          uVar5 = *(ulong *)(pbVar12 + lVar14);
          break;
        default:
          uVar5 = 0;
        }
        if (uVar5 != (long)ptr_00 - (long)ptr) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Array index table is wrong";
          goto LAB_0010bf2e;
        }
        uVar5 = (ulong)"\x01\x01"[*ptr_00];
        local_38 = ptr_00;
        if (uVar5 == 0) {
          uVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&local_38,ptr_00);
        }
        uVar11 = uVar11 + 1;
      }
      if (uVar11 == uVar10) {
        return;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Array has more items than in index";
    }
  }
LAB_0010bf2e:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateIndexedArray(uint8_t const* ptr, std::size_t length) {
  // Array with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength const byteSizeLength =
      1ULL << (static_cast<ValueLength>(head) - 0x06U);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x09U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = ptr + 1 + byteSizeLength;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);
    ValueLength offset = readIntegerNonEmpty<ValueLength>(
        indexTable + actualNrItems * byteSizeLength, byteSizeLength);
    if (offset != static_cast<ValueLength>(member - ptr)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Array index table is wrong");
    }

    member += Slice(member).byteSize();
    ++actualNrItems;
  }

  if (actualNrItems != nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Array has more items than in index");
  }
}